

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sswRarity.c
# Opt level: O0

void Ssw_RarTransferPatterns(Ssw_RarMan_t *p,Vec_Int_t *vInits)

{
  int iVar1;
  int iVar2;
  word *pwVar3;
  double local_40;
  double iCostBest;
  int iPatBest;
  int Value;
  int k;
  int i;
  uint *pPattern;
  uchar *pData;
  Vec_Int_t *vInits_local;
  Ssw_RarMan_t *p_local;
  
  Ssw_RarTranspose(p);
  for (iPatBest = 0; iPatBest < p->pPars->nWords * 0x40; iPatBest = iPatBest + 1) {
    pwVar3 = Ssw_RarPatSim(p,iPatBest);
    for (Value = 0; Value < p->nGroups; Value = Value + 1) {
      Ssw_RarAddToBinPat(p,Value,(uint)*(byte *)((long)pwVar3 + (long)Value));
    }
  }
  iPatBest = 0;
  do {
    if (p->pPars->nWords * 0x40 <= iPatBest) {
      Vec_IntClear(vInits);
      Value = 0;
      while( true ) {
        if (p->pPars->nWords <= Value) {
          iVar1 = Vec_IntSize(vInits);
          iVar2 = Aig_ManRegNum(p->pAig);
          if (iVar1 == iVar2 * p->pPars->nWords) {
            return;
          }
          __assert_fail("Vec_IntSize(vInits) == Aig_ManRegNum(p->pAig) * p->pPars->nWords",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/ssw/sswRarity.c"
                        ,0x367,"void Ssw_RarTransferPatterns(Ssw_RarMan_t *, Vec_Int_t *)");
        }
        iCostBest._0_4_ = -1;
        local_40 = -1000000000.0;
        for (iPatBest = 0; iPatBest < p->pPars->nWords * 0x40; iPatBest = iPatBest + 1) {
          if (local_40 < p->pPatCosts[iPatBest]) {
            local_40 = p->pPatCosts[iPatBest];
            iCostBest._0_4_ = iPatBest;
          }
        }
        if (iCostBest._0_4_ < 0) break;
        p->pPatCosts[iCostBest._0_4_] = -1000000000.0;
        pwVar3 = Ssw_RarPatSim(p,iCostBest._0_4_);
        iPatBest = 0;
        while( true ) {
          iVar1 = Aig_ManRegNum(p->pAig);
          if (iVar1 <= iPatBest) break;
          iVar1 = Abc_InfoHasBit((uint *)pwVar3,iPatBest);
          Vec_IntPush(vInits,iVar1);
          iPatBest = iPatBest + 1;
        }
        Vec_IntPush(p->vPatBests,iCostBest._0_4_);
        Value = Value + 1;
      }
      __assert_fail("iPatBest >= 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/ssw/sswRarity.c"
                    ,0x35e,"void Ssw_RarTransferPatterns(Ssw_RarMan_t *, Vec_Int_t *)");
    }
    pwVar3 = Ssw_RarPatSim(p,iPatBest);
    p->pPatCosts[iPatBest] = 0.0;
    for (Value = 0; Value < p->nGroups; Value = Value + 1) {
      iVar1 = Ssw_RarGetBinPat(p,Value,(uint)*(byte *)((long)pwVar3 + (long)Value));
      if (iVar1 < 1) {
        __assert_fail("Value > 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/ssw/sswRarity.c"
                      ,0x349,"void Ssw_RarTransferPatterns(Ssw_RarMan_t *, Vec_Int_t *)");
      }
      p->pPatCosts[iPatBest] = 1.0 / (double)(iVar1 * iVar1) + p->pPatCosts[iPatBest];
    }
    iPatBest = iPatBest + 1;
  } while( true );
}

Assistant:

static void Ssw_RarTransferPatterns( Ssw_RarMan_t * p, Vec_Int_t * vInits )
{
//    Aig_Obj_t * pObj;
    unsigned char * pData;
    unsigned * pPattern;
    int i, k, Value;

    // more data from regs to pats
    Ssw_RarTranspose( p );

    // update counters
    for ( k = 0; k < p->pPars->nWords * 64; k++ )
    {
        pData = (unsigned char *)Ssw_RarPatSim( p, k );
        for ( i = 0; i < p->nGroups; i++ )
            Ssw_RarAddToBinPat( p, i, pData[i] );
    }

    // for each pattern
    for ( k = 0; k < p->pPars->nWords * 64; k++ )
    {
        pData = (unsigned char *)Ssw_RarPatSim( p, k );
        // find the cost of its values
        p->pPatCosts[k] = 0.0;
        for ( i = 0; i < p->nGroups; i++ )
        {
            Value = Ssw_RarGetBinPat( p, i, pData[i] );
            assert( Value > 0 );
            p->pPatCosts[k] += 1.0/(Value*Value);
        }
        // print the result
//Abc_Print( 1, "%3d : %9.6f\n", k, p->pPatCosts[k] );
    }

    // choose as many as there are words
    Vec_IntClear( vInits );
    for ( i = 0; i < p->pPars->nWords; i++ )
    {
        // select the best
        int iPatBest = -1;
        double iCostBest = -ABC_INFINITY;
        for ( k = 0; k < p->pPars->nWords * 64; k++ )
            if ( iCostBest < p->pPatCosts[k] )
            {
                iCostBest = p->pPatCosts[k];
                iPatBest  = k;
            }
        // remove from costs
        assert( iPatBest >= 0 );
        p->pPatCosts[iPatBest] = -ABC_INFINITY;
        // set the flops
        pPattern = (unsigned *)Ssw_RarPatSim( p, iPatBest );
        for ( k = 0; k < Aig_ManRegNum(p->pAig); k++ )
            Vec_IntPush( vInits, Abc_InfoHasBit(pPattern, k) );
//Abc_Print( 1, "Best pattern %5d\n", iPatBest );
        Vec_IntPush( p->vPatBests, iPatBest );
    }
    assert( Vec_IntSize(vInits) == Aig_ManRegNum(p->pAig) * p->pPars->nWords );
}